

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hayai_outputter.hpp
# Opt level: O0

void hayai::Outputter::WriteTestNameToStream
               (ostream *stream,string *fixtureName,string *testName,
               TestParametersDescriptor *parameters)

{
  bool bVar1;
  ostream *poVar2;
  vector<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_> *this;
  TestParameterDescriptor *pTVar3;
  const_reference pvVar4;
  TestParameterDescriptor *desc;
  size_t i;
  vector<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_> *descs;
  TestParametersDescriptor *parameters_local;
  string *testName_local;
  string *fixtureName_local;
  ostream *stream_local;
  
  poVar2 = std::operator<<(stream,(string *)fixtureName);
  poVar2 = std::operator<<(poVar2,".");
  std::operator<<(poVar2,(string *)testName);
  this = TestParametersDescriptor::Parameters(parameters);
  bVar1 = inja::std::
          vector<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>::
          empty(this);
  if (!bVar1) {
    std::operator<<(stream,"(");
    for (desc = (TestParameterDescriptor *)0x0;
        pTVar3 = (TestParameterDescriptor *)
                 inja::std::
                 vector<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
                 ::size(this), desc < pTVar3;
        desc = (TestParameterDescriptor *)&(desc->Declaration).field_0x1) {
      if (desc != (TestParameterDescriptor *)0x0) {
        std::operator<<(stream,", ");
      }
      pvVar4 = inja::std::
               vector<hayai::TestParameterDescriptor,_std::allocator<hayai::TestParameterDescriptor>_>
               ::operator[](this,(size_type)desc);
      poVar2 = std::operator<<(stream,(string *)pvVar4);
      poVar2 = std::operator<<(poVar2," = ");
      std::operator<<(poVar2,(string *)&pvVar4->Value);
    }
    std::operator<<(stream,")");
  }
  return;
}

Assistant:

static void WriteTestNameToStream(std::ostream& stream,
                                          const std::string& fixtureName,
                                          const std::string& testName,
                                          const TestParametersDescriptor&
                                              parameters)
        {
            stream << fixtureName << "." << testName;

            const std::vector<TestParameterDescriptor>& descs =
                parameters.Parameters();

            if (descs.empty())
                return;

            stream << "(";

            for (std::size_t i = 0; i < descs.size(); ++i)
            {
                if (i)
                    stream << ", ";

                const TestParameterDescriptor& desc = descs[i];
                stream << desc.Declaration << " = " << desc.Value;
            }

            stream << ")";
        }